

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O3

void __thiscall Js::JavascriptSet::Add(JavascriptSet *this,Var value)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  Var value_00;
  undefined4 *puVar5;
  
  pTVar2 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  switch(this->kind) {
  case EmptySet:
    AddToEmptySet(this,value);
    break;
  case IntSet:
    bVar4 = TryAddToIntSet(this,value);
    if (!bVar4) {
      value_00 = JavascriptConversion::TryCanonicalizeAsSimpleVar<false>(value);
      if (value_00 == (Var)0x0) {
        PromoteToComplexVarSet(this);
        Add(this,value);
      }
      else {
        PromoteToSimpleVarSet(this);
        Add(this,value_00);
      }
    }
    break;
  case SimpleVarSet:
    bVar4 = TryAddToSimpleVarSet(this,value);
    if (!bVar4) {
      PromoteToComplexVarSet(this);
      Add(this,value);
    }
    break;
  case ComplexVarSet:
    AddToComplexVarSet(this,value);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1c4,"((0))","(0)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pTVar2->noJsReentrancy = bVar1;
  return;
}

Assistant:

void
JavascriptSet::Add(Var value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());
    switch (this->kind)
    {
    case SetKind::EmptySet:
    {
        this->AddToEmptySet(value);
        return;
    }

    case SetKind::IntSet:
    {
        if (this->TryAddToIntSet(value))
        {
            return;
        }

        Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<false /* allowLossyConversion */>(value);
        if (simpleVar)
        {
            this->PromoteToSimpleVarSet();
            this->Add(simpleVar);
            return;
        }

        this->PromoteToComplexVarSet();
        this->Add(value);
        return;
    }

    case SetKind::SimpleVarSet:
        if (this->TryAddToSimpleVarSet(value))
        {
            return;
        }

        this->PromoteToComplexVarSet();
        this->Add(value);
        return;

    case SetKind::ComplexVarSet:
        this->AddToComplexVarSet(value);
        return;

    default:
        Assume(UNREACHED);
    }
}